

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObject_private.hh
# Opt level: O1

void __thiscall
QPDF_Stream::QPDF_Stream(QPDF_Stream *this,QPDFObjectHandle *stream_dict,size_t length)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  _Head_base<0UL,_QPDF_Stream::Members_*,_false> _Var4;
  logic_error *this_00;
  pointer *__ptr;
  
  _Var4._M_head_impl = (Members *)operator_new(0x58);
  peVar1 = (stream_dict->super_BaseHandle).obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Var2._M_pi = (stream_dict->super_BaseHandle).obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Var2._M_pi)->_M_use_count = (_Var2._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Var2._M_pi)->_M_use_count = (_Var2._M_pi)->_M_use_count + 1;
    }
  }
  (_Var4._M_head_impl)->filter_on_write = true;
  *(element_type **)&((_Var4._M_head_impl)->stream_dict).super_BaseHandle = peVar1;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(_Var4._M_head_impl)->stream_dict + 8))->
  _M_pi = _Var2._M_pi;
  (_Var4._M_head_impl)->length = length;
  ((_Var4._M_head_impl)->stream_data).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = 0;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(_Var4._M_head_impl)->stream_data + 8))->
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ((_Var4._M_head_impl)->stream_provider).
  super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 0;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(_Var4._M_head_impl)->stream_provider + 8))
  ->_M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)
   &((_Var4._M_head_impl)->token_filters).
    super__Vector_base<std::shared_ptr<QPDFObjectHandle::TokenFilter>,_std::allocator<std::shared_ptr<QPDFObjectHandle::TokenFilter>_>_>
       = 0;
  *(pointer *)((long)&(_Var4._M_head_impl)->token_filters + 8) = (pointer)0x0;
  *(pointer *)((long)&(_Var4._M_head_impl)->token_filters + 0x10) = (pointer)0x0;
  (this->m)._M_t.
  super___uniq_ptr_impl<QPDF_Stream::Members,_std::default_delete<QPDF_Stream::Members>_>._M_t.
  super__Tuple_impl<0UL,_QPDF_Stream::Members_*,_std::default_delete<QPDF_Stream::Members>_>.
  super__Head_base<0UL,_QPDF_Stream::Members_*,_false>._M_head_impl = _Var4._M_head_impl;
  bVar3 = QPDFObjectHandle::isDictionary(stream_dict);
  if (bVar3) {
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error
            (this_00,"stream object instantiated with non-dictionary object for dictionary");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

QPDF_Stream(QPDFObjectHandle stream_dict, size_t length) :
        m(std::make_unique<Members>(stream_dict, length))
    {
        if (!stream_dict.isDictionary()) {
            throw std::logic_error(
                "stream object instantiated with non-dictionary object for dictionary");
        }
    }